

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
AllocatorsAreEmpty(HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                   *this)

{
  FreeObject *pFVar1;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this_00;
  
  this_00 = &this->allocatorHead;
  while ((this_00->heapBlock == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0 &&
         (pFVar1 = SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                   ::GetExplicitFreeList(this_00), pFVar1 == (FreeObject *)0x0))) {
    this_00 = this_00->next;
    if (this_00 == &this->allocatorHead) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
HeapBucketT<TBlockType>::AllocatorsAreEmpty() const
{
    TBlockAllocatorType const * current = &allocatorHead;
    do
    {
        if (current->GetHeapBlock() != nullptr || current->GetExplicitFreeList() != nullptr)
        {
            return false;
        }
        current = current->GetNext();
    }
    while (current != &allocatorHead);
    return true;
}